

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_sum_intra_stats(AV1_COMMON *cm,FRAME_COUNTS *counts,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,
                        MB_MODE_INFO *above_mi,MB_MODE_INFO *left_mi,int intraonly)

{
  short *psVar1;
  BLOCK_SIZE BVar2;
  char cVar3;
  BLOCK_SIZE BVar4;
  uint8_t uVar5;
  FILTER_INTRA_MODE FVar6;
  ushort uVar7;
  FRAME_CONTEXT *pFVar8;
  short sVar9;
  byte bVar10;
  byte bVar11;
  aom_cdf_prob *paVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  aom_cdf_prob (*paaVar18) [3];
  int iVar19;
  ushort uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  
  pFVar8 = xd->tile_ctx;
  bVar13 = mbmi->mode;
  BVar2 = mbmi->bsize;
  if (intraonly == 0) {
    bVar10 = ""[BVar2];
    paVar12 = pFVar8->y_mode_cdf[bVar10] + 0xd;
    uVar20 = *paVar12;
    bVar11 = (char)(uVar20 >> 4) + 5;
    lVar17 = 0;
    do {
      uVar7 = pFVar8->y_mode_cdf[bVar10][lVar17];
      if (lVar17 < (char)bVar13) {
        sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar11 & 0x1f));
      }
      else {
        sVar9 = -(uVar7 >> (bVar11 & 0x1f));
      }
      pFVar8->y_mode_cdf[bVar10][lVar17] = sVar9 + uVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0xc);
  }
  else {
    bVar10 = av1_above_block_mode(above_mi);
    bVar11 = av1_left_block_mode(left_mi);
    iVar19 = intra_mode_context[bVar10];
    iVar21 = intra_mode_context[bVar11];
    paVar12 = pFVar8->kf_y_cdf[iVar19][iVar21] + 0xd;
    uVar20 = *paVar12;
    bVar10 = (char)(uVar20 >> 4) + 5;
    lVar17 = 0;
    do {
      uVar7 = pFVar8->kf_y_cdf[iVar19][iVar21][lVar17];
      if (lVar17 < (char)bVar13) {
        sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar10 & 0x1f));
      }
      else {
        sVar9 = -(uVar7 >> (bVar10 & 0x1f));
      }
      pFVar8->kf_y_cdf[iVar19][iVar21][lVar17] = sVar9 + uVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0xc);
  }
  *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
  bVar10 = mbmi->mode;
  if (((((bVar10 == 0) && ((mbmi->palette_mode_info).palette_size[0] == '\0')) &&
       (uVar22 = (ulong)mbmi->bsize, uVar22 != 0xff)) &&
      ((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar22 & 0x3f) & 1) != 0))))
     && ((0x2f0bffUL >> (uVar22 & 0x3f) & 1) != 0)) {
    uVar5 = (mbmi->filter_intra_mode_info).use_filter_intra;
    BVar4 = mbmi->bsize;
    uVar20 = pFVar8->filter_intra_cdfs[BVar4][2];
    bVar11 = (char)(uVar20 >> 4) + 4;
    uVar7 = pFVar8->filter_intra_cdfs[BVar4][0];
    if ((char)uVar5 < '\x01') {
      sVar9 = -(uVar7 >> (bVar11 & 0x1f));
    }
    else {
      sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar11 & 0x1f));
    }
    pFVar8->filter_intra_cdfs[BVar4][0] = sVar9 + uVar7;
    paVar12 = pFVar8->filter_intra_cdfs[BVar4] + 2;
    *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
    if (uVar5 != '\0') {
      FVar6 = (mbmi->filter_intra_mode_info).filter_intra_mode;
      uVar20 = pFVar8->filter_intra_mode_cdf[5];
      bVar11 = (char)(uVar20 >> 4) + 5;
      lVar17 = 0;
      do {
        uVar7 = pFVar8->filter_intra_mode_cdf[lVar17];
        if (lVar17 < (char)FVar6) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar11 & 0x1f));
        }
        else {
          sVar9 = -(uVar7 >> (bVar11 & 0x1f));
        }
        pFVar8->filter_intra_mode_cdf[lVar17] = sVar9 + uVar7;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      pFVar8->filter_intra_mode_cdf[5] = pFVar8->filter_intra_mode_cdf[5] + (ushort)(uVar20 < 0x20);
    }
  }
  if (BLOCK_8X4 < BVar2 && 0xf7 < (byte)(bVar10 - 9)) {
    cVar3 = mbmi->angle_delta[0];
    uVar20 = pFVar8->angle_delta_cdf[(ulong)bVar10 - 1][7];
    bVar11 = (char)(uVar20 >> 4) + 5;
    lVar17 = 0;
    do {
      uVar7 = pFVar8->angle_delta_cdf[(ulong)bVar10 - 1][lVar17];
      if (lVar17 < (char)(cVar3 + '\x03')) {
        sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar11 & 0x1f));
      }
      else {
        sVar9 = -(uVar7 >> (bVar11 & 0x1f));
      }
      pFVar8->angle_delta_cdf[(ulong)bVar10 - 1][lVar17] = sVar9 + uVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 6);
    paVar12 = pFVar8->angle_delta_cdf[(ulong)bVar10 - 1] + 7;
    *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
  }
  if (xd->is_chroma_ref == true) {
    bVar11 = mbmi->uv_mode;
    uVar22 = (ulong)(*xd->mi)->bsize;
    if (xd->lossless[*(ushort *)&(*xd->mi)->field_0xa7 & 7] == 0) {
      bVar23 = (0x2f0bffUL >> (uVar22 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar22 & 0x3f) & 1) == 0) {
        bVar23 = false;
      }
    }
    else {
      bVar23 = av1_ss_size_lookup[uVar22][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y] ==
               BLOCK_4X4;
    }
    lVar15 = (ulong)bVar13 * 0x20 + (ulong)bVar13 * -2;
    lVar17 = lVar15 + (ulong)bVar23 * 0x186 + 0x3226;
    bVar16 = bVar23 + 0xd;
    uVar20 = *(ushort *)((long)pFVar8 + (ulong)bVar16 * 2 + lVar15 + (ulong)bVar23 * 0x186 + 0x3226)
    ;
    bVar13 = (char)(uVar20 >> 4) + 5;
    uVar22 = 0;
    do {
      uVar7 = *(ushort *)((long)pFVar8 + uVar22 * 2 + lVar17);
      if ((long)uVar22 < (long)(char)bVar11) {
        sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar13 & 0x1f));
      }
      else {
        sVar9 = -(uVar7 >> (bVar13 & 0x1f));
      }
      *(ushort *)((long)pFVar8 + uVar22 * 2 + lVar17) = sVar9 + uVar7;
      uVar22 = uVar22 + 1;
    } while (bVar16 - 1 != uVar22);
    psVar1 = (short *)((long)pFVar8 + (ulong)bVar16 * 2 + lVar17);
    *psVar1 = *psVar1 + (ushort)(uVar20 < 0x20);
    if (bVar11 == 0xd) {
      cVar3 = mbmi->cfl_alpha_signs;
      bVar13 = mbmi->cfl_alpha_idx;
      uVar20 = pFVar8->cfl_sign_cdf[8];
      bVar16 = (char)(uVar20 >> 4) + 5;
      lVar17 = 0;
      do {
        uVar7 = pFVar8->cfl_sign_cdf[lVar17];
        if (lVar17 < cVar3) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar16 & 0x1f));
        }
        else {
          sVar9 = -(uVar7 >> (bVar16 & 0x1f));
        }
        pFVar8->cfl_sign_cdf[lVar17] = sVar9 + uVar7;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 7);
      pFVar8->cfl_sign_cdf[8] = pFVar8->cfl_sign_cdf[8] + (ushort)(uVar20 < 0x20);
      uVar14 = (int)cVar3 + (cVar3 + 1) * 10 + 1;
      iVar19 = (int)uVar14 >> 5;
      if (0x1f < uVar14) {
        iVar21 = cVar3 + -2;
        uVar20 = pFVar8->cfl_alpha_cdf[iVar21][0x10];
        bVar16 = (char)(uVar20 >> 4) + 5;
        uVar22 = 0;
        do {
          uVar7 = pFVar8->cfl_alpha_cdf[iVar21][uVar22];
          if (uVar22 < bVar13 >> 4) {
            sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar16 & 0x1f));
          }
          else {
            sVar9 = -(uVar7 >> (bVar16 & 0x1f));
          }
          pFVar8->cfl_alpha_cdf[iVar21][uVar22] = sVar9 + uVar7;
          uVar22 = uVar22 + 1;
        } while (uVar22 != 0xf);
        paVar12 = pFVar8->cfl_alpha_cdf[iVar21] + 0x10;
        *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
      }
      iVar21 = cVar3 + 1 + iVar19 * -3;
      if (iVar21 != 0) {
        iVar19 = iVar21 * 3 + iVar19 + -3;
        uVar20 = pFVar8->cfl_alpha_cdf[iVar19][0x10];
        bVar16 = (char)(uVar20 >> 4) + 5;
        uVar22 = 0;
        do {
          uVar7 = pFVar8->cfl_alpha_cdf[iVar19][uVar22];
          if (uVar22 < (bVar13 & 0xf)) {
            sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar16 & 0x1f));
          }
          else {
            sVar9 = -(uVar7 >> (bVar16 & 0x1f));
          }
          pFVar8->cfl_alpha_cdf[iVar19][uVar22] = sVar9 + uVar7;
          uVar22 = uVar22 + 1;
        } while (uVar22 != 0xf);
        paVar12 = pFVar8->cfl_alpha_cdf[iVar19] + 0x10;
        *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
      }
    }
    bVar13 = get_uv_mode_uv2y[bVar11];
    if (BLOCK_8X4 < BVar2 && 0xf7 < (byte)(bVar13 - 9)) {
      cVar3 = mbmi->angle_delta[1];
      uVar20 = pFVar8->angle_delta_cdf[(ulong)bVar13 - 1][7];
      bVar16 = (char)(uVar20 >> 4) + 5;
      lVar17 = 0;
      do {
        uVar7 = pFVar8->angle_delta_cdf[(ulong)bVar13 - 1][lVar17];
        if (lVar17 < (char)(cVar3 + '\x03')) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar16 & 0x1f));
        }
        else {
          sVar9 = -(uVar7 >> (bVar16 & 0x1f));
        }
        pFVar8->angle_delta_cdf[(ulong)bVar13 - 1][lVar17] = sVar9 + uVar7;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 6);
      paVar12 = pFVar8->angle_delta_cdf[(ulong)bVar13 - 1] + 7;
      *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
    }
    if (((cm->features).allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < BVar2 || ((0xe007U >> (BVar2 & 0x1f) & 1) == 0)))) {
      bVar13 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[mbmi->bsize];
      iVar19 = bVar13 - 6;
      pFVar8 = xd->tile_ctx;
      if (bVar10 == 0) {
        uVar14 = 0;
        if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
          uVar14 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
        }
        uVar5 = (mbmi->palette_mode_info).palette_size[0];
        if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
          uVar14 = (uVar14 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0')
          ;
        }
        paaVar18 = pFVar8->palette_y_mode_cdf[(ulong)bVar13 - 6] + uVar14;
        uVar20 = pFVar8->palette_y_mode_cdf[(ulong)bVar13 - 6][uVar14][2];
        bVar10 = (char)(uVar20 >> 4) + 4;
        uVar7 = (*paaVar18)[0];
        if (uVar5 == '\0') {
          sVar9 = -(uVar7 >> (bVar10 & 0x1f));
        }
        else {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar10 & 0x1f));
        }
        (*paaVar18)[0] = sVar9 + uVar7;
        pFVar8->palette_y_mode_cdf[(ulong)bVar13 - 6][uVar14][2] = uVar20 + (uVar20 < 0x20);
        if (uVar5 != '\0') {
          uVar20 = pFVar8->palette_y_size_cdf[(ulong)bVar13 - 6][7];
          bVar10 = (char)(uVar20 >> 4) + 5;
          lVar17 = 0;
          do {
            uVar7 = pFVar8->palette_y_size_cdf[(ulong)bVar13 - 6][lVar17];
            if (lVar17 < (char)(uVar5 + 0xfe)) {
              sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar10 & 0x1f));
            }
            else {
              sVar9 = -(uVar7 >> (bVar10 & 0x1f));
            }
            pFVar8->palette_y_size_cdf[(ulong)bVar13 - 6][lVar17] = sVar9 + uVar7;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 6);
          paVar12 = pFVar8->palette_y_size_cdf[(ulong)bVar13 - 6] + 7;
          *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
        }
      }
      if (bVar11 == 0) {
        uVar5 = (mbmi->palette_mode_info).palette_size[1];
        bVar23 = (mbmi->palette_mode_info).palette_size[0] != '\0';
        uVar20 = pFVar8->palette_uv_mode_cdf[bVar23][2];
        bVar13 = (char)(uVar20 >> 4) + 4;
        uVar7 = pFVar8->palette_uv_mode_cdf[bVar23][0];
        if (uVar5 == '\0') {
          sVar9 = -(uVar7 >> (bVar13 & 0x1f));
        }
        else {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar13 & 0x1f));
        }
        pFVar8->palette_uv_mode_cdf[bVar23][0] = sVar9 + uVar7;
        pFVar8->palette_uv_mode_cdf[bVar23][2] = uVar20 + (uVar20 < 0x20);
        if (uVar5 != '\0') {
          uVar20 = pFVar8->palette_uv_size_cdf[iVar19][7];
          bVar13 = (char)(uVar20 >> 4) + 5;
          lVar17 = 0;
          do {
            uVar7 = pFVar8->palette_uv_size_cdf[iVar19][lVar17];
            if (lVar17 < (char)(uVar5 + 0xfe)) {
              sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar13 & 0x1f));
            }
            else {
              sVar9 = -(uVar7 >> (bVar13 & 0x1f));
            }
            pFVar8->palette_uv_size_cdf[iVar19][lVar17] = sVar9 + uVar7;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 6);
          paVar12 = pFVar8->palette_uv_size_cdf[iVar19] + 7;
          *paVar12 = *paVar12 + (ushort)(uVar20 < 0x20);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_sum_intra_stats(const AV1_COMMON *const cm, FRAME_COUNTS *counts,
                         MACROBLOCKD *xd, const MB_MODE_INFO *const mbmi,
                         const MB_MODE_INFO *above_mi,
                         const MB_MODE_INFO *left_mi, const int intraonly) {
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const PREDICTION_MODE y_mode = mbmi->mode;
  (void)counts;
  const BLOCK_SIZE bsize = mbmi->bsize;

  if (intraonly) {
#if CONFIG_ENTROPY_STATS
    const PREDICTION_MODE above = av1_above_block_mode(above_mi);
    const PREDICTION_MODE left = av1_left_block_mode(left_mi);
    const int above_ctx = intra_mode_context[above];
    const int left_ctx = intra_mode_context[left];
    ++counts->kf_y_mode[above_ctx][left_ctx][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(get_y_mode_cdf(fc, above_mi, left_mi), y_mode, INTRA_MODES);
  } else {
#if CONFIG_ENTROPY_STATS
    ++counts->y_mode[size_group_lookup[bsize]][y_mode];
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->y_mode_cdf[size_group_lookup[bsize]], y_mode, INTRA_MODES);
  }

  if (av1_filter_intra_allowed(cm, mbmi)) {
    const int use_filter_intra_mode =
        mbmi->filter_intra_mode_info.use_filter_intra;
#if CONFIG_ENTROPY_STATS
    ++counts->filter_intra[mbmi->bsize][use_filter_intra_mode];
    if (use_filter_intra_mode) {
      ++counts
            ->filter_intra_mode[mbmi->filter_intra_mode_info.filter_intra_mode];
    }
#endif  // CONFIG_ENTROPY_STATS
    update_cdf(fc->filter_intra_cdfs[mbmi->bsize], use_filter_intra_mode, 2);
    if (use_filter_intra_mode) {
      update_cdf(fc->filter_intra_mode_cdf,
                 mbmi->filter_intra_mode_info.filter_intra_mode,
                 FILTER_INTRA_MODES);
    }
  }
  if (av1_is_directional_mode(mbmi->mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[mbmi->mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[mbmi->mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_Y] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }

  if (!xd->is_chroma_ref) return;

  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);
#if CONFIG_ENTROPY_STATS
  ++counts->uv_mode[cfl_allowed][y_mode][uv_mode];
#endif  // CONFIG_ENTROPY_STATS
  update_cdf(fc->uv_mode_cdf[cfl_allowed][y_mode], uv_mode,
             UV_INTRA_MODES - !cfl_allowed);
  if (uv_mode == UV_CFL_PRED) {
    const int8_t joint_sign = mbmi->cfl_alpha_signs;
    const uint8_t idx = mbmi->cfl_alpha_idx;

#if CONFIG_ENTROPY_STATS
    ++counts->cfl_sign[joint_sign];
#endif
    update_cdf(fc->cfl_sign_cdf, joint_sign, CFL_JOINT_SIGNS);
    if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_U(joint_sign)][CFL_IDX_U(idx)];
#endif
      update_cdf(cdf_u, CFL_IDX_U(idx), CFL_ALPHABET_SIZE);
    }
    if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
      aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];

#if CONFIG_ENTROPY_STATS
      ++counts->cfl_alpha[CFL_CONTEXT_V(joint_sign)][CFL_IDX_V(idx)];
#endif
      update_cdf(cdf_v, CFL_IDX_V(idx), CFL_ALPHABET_SIZE);
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode) && av1_use_angle_delta(bsize)) {
#if CONFIG_ENTROPY_STATS
    ++counts->angle_delta[intra_mode - V_PRED]
                         [mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA];
#endif
    update_cdf(fc->angle_delta_cdf[intra_mode - V_PRED],
               mbmi->angle_delta[PLANE_TYPE_UV] + MAX_ANGLE_DELTA,
               2 * MAX_ANGLE_DELTA + 1);
  }
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    update_palette_cdf(xd, mbmi, counts);
  }
}